

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtls_record.cc
# Opt level: O1

ssl_open_record_t __thiscall
bssl::dtls_open_record
          (bssl *this,SSL *ssl,uint8_t *out_type,DTLSRecordNumber *out_number,
          Span<unsigned_char> *out,size_t *out_consumed,uint8_t *out_alert,Span<unsigned_char> in)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  ushort *puVar4;
  long lVar5;
  SSLAEADContext *pSVar6;
  long *plVar7;
  uint8_t *puVar8;
  EVP_AEAD *pEVar9;
  ushort uVar10;
  Span<const_unsigned_char> header;
  Span<unsigned_char> in_00;
  char cVar11;
  bool bVar12;
  uint16_t uVar13;
  ushort uVar14;
  uint16_t uVar15;
  int iVar16;
  ssl_open_record_t sVar17;
  uint64_t uVar18;
  pointer __s;
  SSLAEADContext *pSVar19;
  ulong uVar20;
  size_t len;
  uint8_t *puVar21;
  ushort uVar22;
  size_t sVar23;
  size_t *psVar24;
  uint8_t *puVar25;
  Span<const_unsigned_char> in_01;
  OPENSSL_timeval OVar26;
  CBS seq_bytes;
  CBS cbs;
  ParsedDTLSRecord record;
  byte local_e2 [2];
  CBS local_e0;
  SSLAEADContext *local_d0;
  CBS local_c8;
  SSLAEADContext *local_b8;
  uint8_t *puStack_b0;
  CBS local_a8;
  CBS local_98;
  byte local_88 [2];
  uint16_t local_86 [7];
  SSL *local_78;
  ulong *local_70;
  CBS local_68;
  uchar *local_50;
  size_t sStack_48;
  uchar *local_40;
  uchar *puStack_38;
  
  out->data_ = (uchar *)0x0;
  if (*(int *)(*(long *)(this + 0x30) + 0xac) == 1) {
    return ssl_open_record_close_notify;
  }
  if (in.data_ == (uchar *)0x0) {
    return ssl_open_record_partial;
  }
  local_c8.data = out_alert;
  local_c8.len = (size_t)in.data_;
  local_88[0] = 0;
  local_86[0] = 0;
  local_b8 = (SSLAEADContext *)0x0;
  puStack_b0 = (uint8_t *)0x0;
  local_68.data = out_alert;
  local_68.len = (size_t)in.data_;
  psVar24 = out_consumed;
  local_78 = ssl;
  local_70 = (ulong *)out_type;
  iVar16 = CBS_get_u8(&local_c8,local_88);
  if (iVar16 == 0) goto LAB_0023fc1a;
  if ((local_88[0] & 0xe0) == 0x20) {
    if ((local_88[0] & 0x10) != 0) goto LAB_0023fc1a;
    uVar14 = *(ushort *)(*(long *)(this + 0x38) + 8);
    puVar4 = *(ushort **)(*(long *)(this + 0x38) + 0x90);
    if ((puVar4 != (ushort *)0x0) && (uVar3 = *puVar4, uVar14 <= uVar3)) {
      uVar14 = uVar3;
    }
    uVar22 = uVar14 & 0xfffc;
    uVar3 = uVar22 + (local_88[0] & 3);
    uVar10 = (uVar22 - 4) + (local_88[0] & 3);
    if (uVar3 <= uVar14) {
      uVar10 = uVar3;
    }
    if (uVar22 == 0) {
      uVar10 = uVar3;
    }
    len = 2 - (ulong)((local_88[0] & 8) == 0);
    iVar16 = CBS_get_bytes(&local_c8,&local_e0,len);
    if (iVar16 != 0) {
      if ((local_88[0] & 4) == 0) {
        iVar16 = CBS_get_bytes(&local_c8,&local_98,local_c8.len);
        if (iVar16 == 0) goto LAB_0023ff1a;
      }
      else {
        iVar16 = CBS_get_u16_length_prefixed(&local_c8,&local_98);
        if (iVar16 == 0) goto LAB_0023fab8;
      }
      if (*(long *)(*(long *)(this + 0x38) + 0x98) != 0) {
        OVar26 = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
        if (*(ulong *)(*(long *)(*(long *)(this + 0x38) + 0x98) + 0x88) < OVar26.tv_sec) {
          std::__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::reset
                    ((__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                     (*(long *)(this + 0x38) + 0x98),(pointer)0x0);
        }
      }
      lVar5 = *(long *)(this + 0x38);
      if (*(ushort *)(lVar5 + 8) == uVar10) {
        pSVar19 = (SSLAEADContext *)(lVar5 + 8);
      }
      else {
        pSVar19 = *(SSLAEADContext **)(lVar5 + 0x90);
        if ((pSVar19 == (SSLAEADContext *)0x0) || (*(ushort *)&pSVar19->cipher_ != uVar10)) {
          pSVar6 = *(SSLAEADContext **)(lVar5 + 0x98);
          pSVar19 = (SSLAEADContext *)0x0;
          if ((pSVar6 != (SSLAEADContext *)0x0) &&
             (pSVar19 = (SSLAEADContext *)0x0, *(ushort *)&pSVar6->cipher_ == uVar10)) {
            pSVar19 = pSVar6;
          }
        }
      }
      if ((((pSVar19 == (SSLAEADContext *)0x0) || (*(short *)(*(long *)(this + 0x30) + 0xd0) == 0))
          || (local_d0 = pSVar19, uVar13 = ssl_protocol_version((SSL *)this), uVar10 == 0)) ||
         (uVar13 < 0x304)) {
LAB_0023fab4:
        bVar12 = true;
        goto LAB_0023faba;
      }
      local_b8 = local_d0;
      plVar7 = *(long **)&(local_d0->ctx_).ctx_.state;
      cVar11 = (**(code **)(*plVar7 + 0x20))(plVar7,local_e2,2,local_98.data,local_98.len);
      if (cVar11 != '\0') {
        if (local_e0.len == 0) {
          uVar14 = 0;
        }
        else {
          sVar23 = 0;
          uVar14 = 0;
          do {
            bVar1 = local_e0.data[sVar23];
            bVar2 = local_e2[sVar23];
            local_e0.data[sVar23] = bVar1 ^ bVar2;
            uVar14 = (ushort)(bVar1 ^ bVar2) | uVar14 << 8;
            sVar23 = sVar23 + 1;
          } while (local_e0.len != sVar23);
        }
        uVar18 = reconstruct_seqnum(uVar14,(ulong)(uint)~(-1 << ((byte)((int)len << 3) & 0x1f)),
                                    *(uint64_t *)((long)&(local_d0->ctx_).ctx_.state + 0x28));
        puStack_b0 = (uint8_t *)((ulong)uVar10 << 0x30 | uVar18);
        if (cVar11 != '\0') goto LAB_0023fab4;
      }
    }
LAB_0023fab8:
    bVar12 = false;
  }
  else {
    iVar16 = CBS_get_u16(&local_c8,local_86);
    if (((iVar16 == 0) || (iVar16 = CBS_get_u64(&local_c8,(uint64_t *)&local_e0), iVar16 == 0)) ||
       (iVar16 = CBS_get_u16_length_prefixed(&local_c8,&local_98), uVar13 = local_86[0],
       puVar25 = local_e0.data, iVar16 == 0)) goto LAB_0023fab8;
    puStack_b0 = local_e0.data;
    if (local_e0.data < (uint8_t *)0x1000000000000) {
      bVar12 = (local_86[0] & 0xff00) == 0xfe00;
    }
    else {
      if (*(short *)(*(long *)(this + 0x30) + 0xd0) == 0) {
        uVar14 = 0xfeff;
      }
      else {
        uVar15 = ssl_protocol_version((SSL *)this);
        uVar14 = 0xfefd;
        if (uVar15 < 0x304) {
          uVar14 = *(ushort *)(*(long *)(this + 0x30) + 0xd0);
        }
      }
      bVar12 = uVar13 == uVar14;
    }
    if (((bVar12) && (*(short *)(*(long *)(this + 0x38) + 8) == (short)((ulong)puVar25 >> 0x30))) &&
       ((*(short *)(*(long *)(this + 0x30) + 0xd0) == 0 ||
        ((uVar13 = ssl_protocol_version((SSL *)this), puVar25 < (uint8_t *)0x1000000000000 ||
         (uVar13 < 0x304)))))) {
      local_b8 = (SSLAEADContext *)(*(long *)(this + 0x38) + 8);
    }
  }
LAB_0023faba:
  if ((bVar12) && (local_98.len < 0x4141)) {
    iVar16 = CBS_get_bytes(&local_68,&local_a8,(long)local_98.data - (long)local_68.data);
    if (iVar16 == 0) {
LAB_0023ff1a:
      abort();
    }
    in_01.size_ = (size_t)psVar24;
    in_01.data_ = (uchar *)local_a8.len;
    ssl_do_msg_callback(this,(SSL *)0x0,0x100,(int)local_a8.data,in_01);
    uVar13 = local_86[0];
    bVar1 = local_88[0];
    puVar25 = puStack_b0;
    if (local_b8 != (SSLAEADContext *)0x0) {
      puVar21 = (uint8_t *)((ulong)puStack_b0 & 0xffffffffffff);
      puVar8 = *(uint8_t **)((long)&(local_b8->ctx_).ctx_.state + 0x28);
      uVar20 = (long)puVar8 - (long)puVar21;
      if ((puVar8 < puVar21) ||
         ((uVar20 < 0x100 &&
          ((*(ulong *)((long)&(local_b8->ctx_).ctx_.state + (uVar20 >> 6) * 8 + 8) >>
            (uVar20 & 0x3f) & 1) == 0)))) {
        pSVar19 = (SSLAEADContext *)(local_b8->ctx_).ctx_.aead;
        if ((*(short *)(*(long *)(this + 0x30) + 0xd0) != 0) &&
           (local_d0 = pSVar19, uVar15 = ssl_protocol_version((SSL *)this), pSVar19 = local_d0,
           0x303 < uVar15)) {
          puVar25 = puVar21;
        }
        local_40 = local_a8.data;
        puStack_38 = (uchar *)local_a8.len;
        local_50 = local_98.data;
        sStack_48 = local_98.len;
        header.size_ = local_a8.len;
        header.data_ = local_a8.data;
        in_00.size_ = local_98.len;
        in_00.data_ = local_98.data;
        bVar12 = SSLAEADContext::Open
                           (pSVar19,(Span<unsigned_char> *)out_number,bVar1,uVar13,(uint64_t)puVar25
                            ,header,in_00);
        if (bVar12) {
          out->data_ = in.data_ + -local_c8.len;
          pEVar9 = (local_b8->ctx_).ctx_.aead;
          lVar5._0_1_ = pEVar9->key_len;
          lVar5._1_1_ = pEVar9->nonce_len;
          lVar5._2_1_ = pEVar9->overhead;
          lVar5._3_1_ = pEVar9->max_tag_len;
          lVar5._4_4_ = pEVar9->seal_scatter_supports_extra_in;
          if (lVar5 == 0) {
            bVar12 = false;
          }
          else {
            uVar13 = ssl_protocol_version((SSL *)this);
            bVar12 = 0x303 < uVar13;
          }
          if (((ulong)bVar12 | 0x4000) < out_number[1].combined_) {
            ERR_put_error(0x10,0,0x88,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                          ,0x15d);
            *(undefined1 *)out_consumed = 0x16;
            return ssl_open_record_error;
          }
          if (bVar12 != false) {
            uVar20 = out_number[1].combined_;
            do {
              if (uVar20 == 0) {
                ERR_put_error(0x10,0,0x8b,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                              ,0x165);
                *(undefined1 *)out_consumed = 0x33;
                return ssl_open_record_error;
              }
              local_88[0] = *(byte *)((out_number->combined_ - 1) + uVar20);
              if (uVar20 - 1 <= uVar20) {
                uVar20 = uVar20 - 1;
              }
              out_number[1].combined_ = uVar20;
            } while (local_88[0] == 0);
          }
          DTLSReplayBitmap::Record
                    ((DTLSReplayBitmap *)((long)&(local_b8->ctx_).ctx_.state + 8),
                     (ulong)puStack_b0 & 0xffffffffffff);
          if (local_b8 == *(SSLAEADContext **)(*(long *)(this + 0x38) + 0x90)) {
            uVar13 = ssl_protocol_version((SSL *)this);
            if (uVar13 < 0x304) {
              __assert_fail("ssl_protocol_version(ssl) >= TLS1_3_VERSION",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                            ,0x175,
                            "enum ssl_open_record_t bssl::dtls_open_record(SSL *, uint8_t *, DTLSRecordNumber *, Span<uint8_t> *, size_t *, uint8_t *, Span<uint8_t>)"
                           );
            }
            __s = (pointer)OPENSSL_malloc(0x90);
            if (__s == (pointer)0x0) {
              __s = (pointer)0x0;
            }
            else {
              memset(__s,0,0x90);
            }
            if (__s == (pointer)0x0) {
              *(undefined1 *)out_consumed = 0x50;
              local_e0.data = (uint8_t *)0x0;
            }
            else {
              local_e0.data = (uint8_t *)__s;
              OVar26 = ssl_ctx_get_current_time(*(SSL_CTX **)(this + 0x68));
              uVar18 = 0xffffffffffffffff;
              if (OVar26.tv_sec < 0xffffffffffffff0f) {
                uVar18 = OVar26.tv_sec + 0xf0;
              }
              *(uint64_t *)((long)local_e0.data + 0x88) = uVar18;
              DTLSReadEpoch::operator=
                        ((DTLSReadEpoch *)local_e0.data,
                         (DTLSReadEpoch *)(*(long *)(this + 0x38) + 8));
              puVar25 = local_e0.data;
              local_e0.data = (uint8_t *)0x0;
              std::__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)
                         (*(long *)(this + 0x38) + 0x98),(pointer)puVar25);
              DTLSReadEpoch::operator=
                        ((DTLSReadEpoch *)(*(long *)(this + 0x38) + 8),
                         *(DTLSReadEpoch **)(*(long *)(this + 0x38) + 0x90));
              std::__uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter>::reset
                        ((__uniq_ptr_impl<bssl::DTLSReadEpoch,_bssl::internal::Deleter> *)
                         (*(long *)(this + 0x38) + 0x90),(pointer)0x0);
            }
            std::unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<bssl::DTLSPrevReadEpoch,_bssl::internal::Deleter> *)&local_e0);
            if (__s == (pointer)0x0) {
              return ssl_open_record_error;
            }
          }
          if (local_88[0] == 0x17) {
            if ((*(short *)(*(long *)(this + 0x30) + 0xd0) == 0) ||
               (uVar13 = ssl_protocol_version((SSL *)this), uVar13 < 0x304)) {
              bVar12 = (uint8_t *)0xffffffffffff < puStack_b0;
            }
            else {
              if (((ulong)puStack_b0 & 0xffff000000000000) == 0x1000000000000) goto LAB_0023fecc;
              bVar12 = 2 < (ushort)((ulong)puStack_b0 >> 0x30);
            }
            if (!bVar12) {
              ERR_put_error(0x10,0,0xe1,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/dtls_record.cc"
                            ,0x19e);
              *(undefined1 *)out_consumed = 10;
              return ssl_open_record_error;
            }
          }
          else if (local_88[0] == 0x15) {
            sVar17 = ssl_process_alert((SSL *)this,(uint8_t *)out_consumed,
                                       *(Span<const_unsigned_char> *)out_number);
            return sVar17;
          }
LAB_0023fecc:
          *(undefined1 *)(*(long *)(this + 0x30) + 0xd5) = 0;
          *(byte *)&local_78->method = local_88[0];
          *local_70 = (ulong)puStack_b0;
          return ssl_open_record_success;
        }
        ERR_clear_error();
      }
    }
    in.data_ = in.data_ + -local_c8.len;
  }
LAB_0023fc1a:
  out->data_ = in.data_;
  return ssl_open_record_discard;
}

Assistant:

enum ssl_open_record_t dtls_open_record(SSL *ssl, uint8_t *out_type,
                                        DTLSRecordNumber *out_number,
                                        Span<uint8_t> *out,
                                        size_t *out_consumed,
                                        uint8_t *out_alert, Span<uint8_t> in) {
  *out_consumed = 0;
  if (ssl->s3->read_shutdown == ssl_shutdown_close_notify) {
    return ssl_open_record_close_notify;
  }

  if (in.empty()) {
    return ssl_open_record_partial;
  }

  CBS cbs(in);
  ParsedDTLSRecord record;
  if (!parse_dtls_record(ssl, &cbs, &record)) {
    // The record header was incomplete or malformed. Drop the entire packet.
    *out_consumed = in.size();
    return ssl_open_record_discard;
  }

  ssl_do_msg_callback(ssl, 0 /* read */, SSL3_RT_HEADER, record.header);

  if (record.read_epoch == nullptr ||
      record.read_epoch->bitmap.ShouldDiscard(record.number.sequence())) {
    // Drop this record. It's from an unknown epoch or is a replay. Note that if
    // the record is from next epoch, it could be buffered for later. For
    // simplicity, drop it and expect retransmit to handle it later; DTLS must
    // handle packet loss anyway.
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }

  // Decrypt the body in-place.
  if (!record.read_epoch->aead->Open(out, record.type, record.version,
                                     dtls_aead_sequence(ssl, record.number),
                                     record.header,
                                     cbs_to_writable_bytes(record.body))) {
    // Bad packets are silently dropped in DTLS. See section 4.2.1 of RFC 6347.
    // Clear the error queue of any errors decryption may have added. Drop the
    // entire packet as it must not have come from the peer.
    //
    // TODO(davidben): This doesn't distinguish malloc failures from encryption
    // failures.
    ERR_clear_error();
    *out_consumed = in.size() - CBS_len(&cbs);
    return ssl_open_record_discard;
  }
  *out_consumed = in.size() - CBS_len(&cbs);

  // DTLS 1.3 hides the record type inside the encrypted data.
  bool has_padding = !record.read_epoch->aead->is_null_cipher() &&
                     ssl_protocol_version(ssl) >= TLS1_3_VERSION;
  // Check the plaintext length.
  size_t plaintext_limit = SSL3_RT_MAX_PLAIN_LENGTH + (has_padding ? 1 : 0);
  if (out->size() > plaintext_limit) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_DATA_LENGTH_TOO_LONG);
    *out_alert = SSL_AD_RECORD_OVERFLOW;
    return ssl_open_record_error;
  }

  if (has_padding) {
    do {
      if (out->empty()) {
        OPENSSL_PUT_ERROR(SSL, SSL_R_DECRYPTION_FAILED_OR_BAD_RECORD_MAC);
        *out_alert = SSL_AD_DECRYPT_ERROR;
        return ssl_open_record_error;
      }
      record.type = out->back();
      *out = out->subspan(0, out->size() - 1);
    } while (record.type == 0);
  }

  record.read_epoch->bitmap.Record(record.number.sequence());

  // Once we receive a record from the next epoch in DTLS 1.3, it becomes the
  // current epoch. Also save the previous epoch. This allows us to handle
  // packet reordering on KeyUpdate, as well as ACK retransmissions of the
  // Finished flight.
  if (record.read_epoch == ssl->d1->next_read_epoch.get()) {
    assert(ssl_protocol_version(ssl) >= TLS1_3_VERSION);
    auto prev = MakeUnique<DTLSPrevReadEpoch>();
    if (prev == nullptr) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return ssl_open_record_error;
    }

    // Release the epoch after a timeout.
    prev->expire = ssl_ctx_get_current_time(ssl->ctx.get()).tv_sec;
    if (prev->expire >= UINT64_MAX - DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS) {
      prev->expire = UINT64_MAX;  // Saturate on overflow.
    } else {
      prev->expire += DTLS_PREV_READ_EPOCH_EXPIRE_SECONDS;
    }

    prev->epoch = std::move(ssl->d1->read_epoch);
    ssl->d1->prev_read_epoch = std::move(prev);
    ssl->d1->read_epoch = std::move(*ssl->d1->next_read_epoch);
    ssl->d1->next_read_epoch = nullptr;
  }

  // TODO(davidben): Limit the number of empty records as in TLS? This is only
  // useful if we also limit discarded packets.

  if (record.type == SSL3_RT_ALERT) {
    return ssl_process_alert(ssl, out_alert, *out);
  }

  // Reject application data in epochs that do not allow it.
  if (record.type == SSL3_RT_APPLICATION_DATA) {
    bool app_data_allowed;
    if (ssl->s3->version != 0 && ssl_protocol_version(ssl) >= TLS1_3_VERSION) {
      // Application data is allowed in 0-RTT (epoch 1) and after the handshake
      // (3 and up).
      app_data_allowed =
          record.number.epoch() == 1 || record.number.epoch() >= 3;
    } else {
      // Application data is allowed starting epoch 1.
      app_data_allowed = record.number.epoch() >= 1;
    }
    if (!app_data_allowed) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_RECORD);
      *out_alert = SSL_AD_UNEXPECTED_MESSAGE;
      return ssl_open_record_error;
    }
  }

  ssl->s3->warning_alert_count = 0;

  *out_type = record.type;
  *out_number = record.number;
  return ssl_open_record_success;
}